

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

string * __thiscall
vkt::shaderexecutor::intervalToString<tcu::Matrix<float,2,4>>
          (string *__return_storage_ptr__,shaderexecutor *this,FloatFormat *fmt,IVal *ival)

{
  ostringstream oss;
  ostringstream local_250 [112];
  ios_base local_1e0 [264];
  Matrix<tcu::Interval,_2,_4> local_d8;
  
  std::__cxx11::ostringstream::ostringstream(local_250);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix(&local_d8,(Matrix<tcu::Interval,_2,_4> *)fmt);
  ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doPrintIVal
            ((FloatFormat *)this,&local_d8,(ostream *)local_250);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_250);
  std::ios_base::~ios_base(local_1e0);
  return __return_storage_ptr__;
}

Assistant:

string intervalToString (const FloatFormat& fmt, const typename Traits<T>::IVal& ival)
{
	ostringstream oss;
	printIVal<T>(fmt, ival, oss);
	return oss.str();
}